

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

QCborArray __thiscall QCborValue::toArray(QCborValue *this)

{
  int *piVar1;
  long *in_RSI;
  long in_FS_OFFSET;
  QCborArray local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QCborArray::QCborArray(&local_20);
  if ((int)in_RSI[2] == 0x80) {
    piVar1 = (int *)in_RSI[1];
    if (piVar1 == (int *)0x0 || -1 < *in_RSI) {
      QCborArray::QCborArray((QCborArray *)this);
    }
    else {
      *(int **)this = piVar1;
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  else {
    QCborArray::QCborArray((QCborArray *)this,&local_20);
  }
  QCborArray::~QCborArray(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QCborArray QCborValue::toArray() const
{
    return toArray(QCborArray());
}